

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

QFontEngine *
QFontDatabasePrivate::loadSingleEngine
          (int script,QFontDef *request,QtFontFamily *family,QtFontFoundry *foundry,
          QtFontStyle *style,QtFontSize *size)

{
  ushort uVar1;
  long lVar2;
  uint3 uVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  QFontCache *this;
  QFontEngine *this_00;
  ulong uVar9;
  QFontEngine *pQVar10;
  undefined8 uVar11;
  long lVar12;
  uchar uVar13;
  undefined8 *puVar14;
  QArrayDataPointer<QString> *pQVar15;
  Key *pKVar16;
  uint uVar17;
  long in_FS_OFFSET;
  QStringView QVar18;
  QStringView QVar19;
  char local_130 [24];
  char *local_118;
  QArrayDataPointer<QString> local_110;
  QArrayData *local_f8;
  char16_t *local_f0;
  qsizetype qStack_e8;
  QArrayDataPointer<QString> local_e0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  local_c8;
  qreal local_c0;
  double dStack_b8;
  ulong local_b0;
  Key key;
  long *plVar8;
  
  bVar5 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  plVar8 = (long *)CONCAT44(extraout_var,iVar7);
  uVar1 = *(ushort *)&size->field_0x8;
  uVar17 = (uint)uVar1;
  if ((uVar1 == 0) ||
     (((uVar1 == 0xffff && ((*(uint *)&style->field_0x4 & 2) != 0)) ||
      (cVar4 = (**(code **)(*plVar8 + 0x80))(plVar8), cVar4 != '\0')))) {
    uVar17 = (uint)request->pixelSize;
  }
  puVar14 = &DAT_006a73a0;
  pQVar15 = &local_110;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    pQVar15->d = (Data *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar5 * -2 + 1;
    pQVar15 = (QArrayDataPointer<QString> *)((long)pQVar15 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_110.d = (request->families).d.d;
  local_110.ptr = (request->families).d.ptr;
  local_110.size = (request->families).d.size;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f8 = &((request->styleName).d.d)->super_QArrayData;
  local_f0 = (request->styleName).d.ptr;
  qStack_e8 = (request->styleName).d.size;
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0.d = (request->fallBackFamilies).d.d;
  local_e0.ptr = (request->fallBackFamilies).d.ptr;
  local_e0.size = (request->fallBackFamilies).d.size;
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_*>
        )(request->variableAxisValues).d.d.ptr;
  if (local_c8.d.ptr !=
      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)0x0) {
    LOCK();
    (((QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)local_c8.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                        *)local_c8.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_c0 = request->pointSize;
  local_b0 = *(ulong *)&request->field_0x60;
  dStack_b8 = (double)(int)uVar17;
  this = QFontCache::instance();
  puVar14 = &DAT_006a7330;
  pKVar16 = &key;
  for (lVar12 = 0xe; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pKVar16->def).families.d.d = (Data *)*puVar14;
    puVar14 = puVar14 + (ulong)bVar5 * -2 + 1;
    pKVar16 = (Key *)((long)pKVar16 + (ulong)bVar5 * -0x10 + 8);
  }
  key.def.families.d.d = local_110.d;
  key.def.families.d.ptr = local_110.ptr;
  key.def.families.d.size = local_110.size;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  key.def.styleName.d.d = (Data *)local_f8;
  key.def.styleName.d.ptr = local_f0;
  key.def.styleName.d.size = qStack_e8;
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_f8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  key.def.fallBackFamilies.d.d = local_e0.d;
  key.def.fallBackFamilies.d.ptr = local_e0.ptr;
  key.def.fallBackFamilies.d.size = local_e0.size;
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  key.def.variableAxisValues.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
        )(QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
          )local_c8.d.ptr;
  if (local_c8.d.ptr !=
      (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
       *)0x0) {
    LOCK();
    *(int *)local_c8.d.ptr = *(int *)local_c8.d.ptr + 1;
    UNLOCK();
  }
  key.def._96_8_ = local_b0;
  key.def.pointSize = local_c0;
  key.def.pixelSize = dStack_b8;
  uVar13 = (uchar)script;
  key._105_1_ = key._105_1_ & 0xfe;
  key.script = uVar13;
  this_00 = QFontCache::findEngine(this,&key);
  if (this_00 != (QFontEngine *)0x0) goto LAB_0025a21f;
  if (script == 2) {
    bVar6 = true;
    bVar5 = 0;
LAB_0025a027:
    uVar3 = *(uint3 *)&style->key;
    uVar9 = *(ulong *)&request->field_0x60;
    if (((uVar9 & 0xfff0000) == 0 || uVar3 < 0x1000) ||
       (((lVar12 = (request->styleName).d.size, lVar12 != 0 && (lVar12 == (style->styleName).d.size)
         ) && (QVar18.m_data = (request->styleName).d.ptr, QVar18.m_size = lVar12,
              QVar19.m_data = (style->styleName).d.ptr, QVar19.m_size = lVar12,
              cVar4 = QtPrivate::equalStrings(QVar18,QVar19), cVar4 != '\0')))) {
      if ((uVar9 & 0xfff0000) == 0) {
        uVar9 = 0x640000;
        goto LAB_0025a0f8;
      }
    }
    else {
      uVar9 = (ulong)(((int)((int)(short)((short)((int3)uVar3 >> 0xc) / 2) +
                            ((uint)uVar9 >> 0x10 & 0xfff) * 100) / ((int)((uint)uVar3 << 8) >> 0x14)
                      & 0xfffU) << 0x10);
LAB_0025a0f8:
      local_b0 = local_b0 & 0xfffffffff000ffff | uVar9;
    }
    this_00 = (QFontEngine *)(**(code **)(*plVar8 + 0x40))(plVar8,&local_110,size->handle);
    if (this_00 != (QFontEngine *)0x0) {
      if ((!bVar6) || (bVar6 = QFontEngine::supportsScript(this_00,script), bVar6)) {
        this_00->isSmoothlyScalable = (bool)((byte)style->field_0x4 >> 1 & 1);
        QFontCache::insertEngine(this,&key,this_00,false);
        if ((bVar5 == 0) || (this_00->symbol != false)) goto LAB_0025a21f;
        key.script = '\x02';
        pQVar10 = QFontCache::findEngine(this,&key);
        if (pQVar10 != (QFontEngine *)0x0) goto LAB_0025a21f;
        goto LAB_0025a19d;
      }
      QtPrivateLogging::lcFontDb();
      if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledInfo._q_value._M_base.
                 _M_i & 1) != 0) {
        local_130[0] = '\x02';
        local_130[1] = '\0';
        local_130[2] = '\0';
        local_130[3] = '\0';
        local_130[0x14] = '\0';
        local_130[0x15] = '\0';
        local_130[0x16] = '\0';
        local_130[0x17] = '\0';
        local_130[4] = '\0';
        local_130[5] = '\0';
        local_130[6] = '\0';
        local_130[7] = '\0';
        local_130[8] = '\0';
        local_130[9] = '\0';
        local_130[10] = '\0';
        local_130[0xb] = '\0';
        local_130[0xc] = '\0';
        local_130[0xd] = '\0';
        local_130[0xe] = '\0';
        local_130[0xf] = '\0';
        local_130[0x10] = '\0';
        local_130[0x11] = '\0';
        local_130[0x12] = '\0';
        local_130[0x13] = '\0';
        local_118 = QtPrivateLogging::lcFontDb::category.name;
        uVar11 = QString::utf16();
        QMessageLogger::info
                  (local_130,"OpenType support missing for \"%ls\", script %d",uVar11,
                   (ulong)(uint)script);
      }
      if ((this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_00->_vptr_QFontEngine[1])(this_00);
      }
    }
    this_00 = (QFontEngine *)0x0;
  }
  else {
    bVar5 = family->writingSystems[1] & 1;
    bVar6 = script < 0xab;
    if ((0xaa < script) || (bVar5 == 0)) goto LAB_0025a027;
    key.script = '\x02';
    this_00 = QFontCache::findEngine(this,&key);
    if (this_00 == (QFontEngine *)0x0) {
      bVar6 = true;
      bVar5 = 1;
      key.script = uVar13;
      goto LAB_0025a027;
    }
    key.script = uVar13;
    bVar6 = QFontEngine::supportsScript(this_00,script);
    if (!bVar6) {
      QtPrivateLogging::lcFontDb();
      if (((byte)QtPrivateLogging::lcFontDb::category.field_2.bools.enabledInfo._q_value._M_base.
                 _M_i & 1) != 0) {
        local_130[0] = '\x02';
        local_130[1] = '\0';
        local_130[2] = '\0';
        local_130[3] = '\0';
        local_130[0x14] = '\0';
        local_130[0x15] = '\0';
        local_130[0x16] = '\0';
        local_130[0x17] = '\0';
        local_130[4] = '\0';
        local_130[5] = '\0';
        local_130[6] = '\0';
        local_130[7] = '\0';
        local_130[8] = '\0';
        local_130[9] = '\0';
        local_130[10] = '\0';
        local_130[0xb] = '\0';
        local_130[0xc] = '\0';
        local_130[0xd] = '\0';
        local_130[0xe] = '\0';
        local_130[0xf] = '\0';
        local_130[0x10] = '\0';
        local_130[0x11] = '\0';
        local_130[0x12] = '\0';
        local_130[0x13] = '\0';
        local_118 = QtPrivateLogging::lcFontDb::category.name;
        uVar11 = QString::utf16();
        QMessageLogger::info
                  (local_130,"OpenType support missing for \"%ls\", script %d",uVar11,
                   (ulong)(uint)script);
      }
      this_00 = (QFontEngine *)0x0;
      goto LAB_0025a21f;
    }
    this_00->isSmoothlyScalable = (bool)((byte)style->field_0x4 >> 1 & 1);
LAB_0025a19d:
    QFontCache::insertEngine(this,&key,this_00,false);
  }
LAB_0025a21f:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&key.def.variableAxisValues.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&key.def.fallBackFamilies.d);
  if (key.def.styleName.d.d != (Data *)0x0) {
    LOCK();
    ((key.def.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((key.def.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((key.def.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(key.def.styleName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&key);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_c8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e0);
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QFontEngine *QFontDatabasePrivate::loadSingleEngine(int script,
                              const QFontDef &request,
                              QtFontFamily *family, QtFontFoundry *foundry,
                              QtFontStyle *style, QtFontSize *size)
{
    Q_UNUSED(foundry);

    Q_ASSERT(size);
    QPlatformFontDatabase *pfdb = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    int pixelSize = size->pixelSize;
    if (!pixelSize || (style->smoothScalable && pixelSize == SMOOTH_SCALABLE)
        || pfdb->fontsAlwaysScalable()) {
        pixelSize = request.pixelSize;
    }

    QFontDef def = request;
    def.pixelSize = pixelSize;

    QFontCache *fontCache = QFontCache::instance();

    QFontCache::Key key(def,script);
    QFontEngine *engine = fontCache->findEngine(key);
    if (!engine) {
        const bool cacheForCommonScript = script != QFontDatabasePrivate::Script_Common
                && (family->writingSystems[QFontDatabase::Latin] & QtFontFamily::Supported) != 0;

        if (Q_LIKELY(cacheForCommonScript) && script < QChar::ScriptCount) {
            // fast path: check if engine was loaded for another script
            key.script = QChar::Script_Common;
            engine = fontCache->findEngine(key);
            key.script = script;
            if (engine) {
                // Also check for OpenType tables when using complex scripts
                if (Q_UNLIKELY(!engine->supportsScript(QChar::Script(script)))) {
                    qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                           qUtf16Printable(def.families.constFirst()), script);
                    return nullptr;
                }

                engine->isSmoothlyScalable = style->smoothScalable;
                fontCache->insertEngine(key, engine);
                return engine;
            }
        }

        // To avoid synthesized stretch we need a matching stretch to be 100 after this point.
        // If stretch didn't match exactly we need to calculate the new stretch factor.
        // This only done if not matched by styleName.
        if (style->key.stretch != 0 && request.stretch != 0
            && (request.styleName.isEmpty() || request.styleName != style->styleName)) {
            def.stretch = (request.stretch * 100 + style->key.stretch / 2) / style->key.stretch;
        } else if (request.stretch == QFont::AnyStretch) {
            def.stretch = 100;
        }

        engine = pfdb->fontEngine(def, size->handle);
        if (engine) {
            // Also check for OpenType tables when using complex scripts
            if (script < QChar::ScriptCount && !engine->supportsScript(QChar::Script(script))) {
                qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                       qUtf16Printable(def.families.constFirst()), script);
                if (engine->ref.loadRelaxed() == 0)
                    delete engine;
                return nullptr;
            }

            engine->isSmoothlyScalable = style->smoothScalable;
            fontCache->insertEngine(key, engine);

            if (Q_LIKELY(cacheForCommonScript && !engine->symbol)) {
                // cache engine for Common script as well
                key.script = QChar::Script_Common;
                if (!fontCache->findEngine(key))
                    fontCache->insertEngine(key, engine);
            }
        }
    }
    return engine;
}